

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

void __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL>,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
::tuple_base(tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL>,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
             *this)

{
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL>,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
  *this_local;
  
  tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>);
  tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_false>);
  tuple_value<2UL,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<2UL,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_false>);
  tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<3UL,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_false>);
  tuple_value<4UL,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_false>::tuple_value
            (&this->super_tuple_value<4UL,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_false>
            );
  tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_false>::tuple_value
            (&this->
              super_tuple_value<5UL,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_false>);
  tuple_value<6UL,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_false>::tuple_value
            (&this->super_tuple_value<6UL,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_false>
            );
  tuple_value<7UL,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<7UL,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_false>);
  tuple_value<8UL,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<8UL,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_false>);
  tuple_value<9UL,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<9UL,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_false>);
  tuple_value<10UL,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<10UL,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_false>)
  ;
  tuple_value<11UL,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<11UL,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_false>)
  ;
  tuple_value<12UL,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<12UL,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_false>)
  ;
  tuple_value<13UL,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<13UL,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_false>)
  ;
  tuple_value<14UL,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<14UL,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_false>)
  ;
  tuple_value<15UL,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_false>::tuple_value
            (&this->
              super_tuple_value<15UL,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_false>)
  ;
  tuple_value<16UL,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_false>::tuple_value
            (&this->
              super_tuple_value<16UL,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_false>)
  ;
  tuple_value<17UL,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_false>::tuple_value
            (&this->
              super_tuple_value<17UL,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_false>
            );
  tuple_value<18UL,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_false>::tuple_value
            (&this->
              super_tuple_value<18UL,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_false>
            );
  tuple_value<19UL,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_false>::tuple_value
            (&this->
              super_tuple_value<19UL,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_false>);
  tuple_value<20UL,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_false>::tuple_value
            (&this->
              super_tuple_value<20UL,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_false>);
  tuple_value<21UL,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_false>::tuple_value
            (&this->
              super_tuple_value<21UL,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_false>)
  ;
  tuple_value<22UL,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_false>::tuple_value
            (&this->
              super_tuple_value<22UL,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_false>);
  tuple_value<23UL,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>,_false>::tuple_value
            (&this->
              super_tuple_value<23UL,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>,_false>
            );
  return;
}

Assistant:

constexpr tuple_base() = default;